

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O3

QueryResult * __thiscall
Query::run(QueryResult *__return_storage_ptr__,Query *this,QueryPrimitive *primitive,
          PrefetchFunc *prefetcher,QueryCounters *counters)

{
  uint32_t uVar1;
  QueryType QVar2;
  Query *pQVar3;
  pointer pQVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  runtime_error *this_00;
  uint32_t cutoff;
  Query *query;
  ulong uVar8;
  Query *this_01;
  pointer this_02;
  int iVar9;
  long lVar10;
  QueryResult next;
  vector<QueryResult_*,_std::allocator<QueryResult_*>_> results_ptrs;
  vector<QueryResult,_std::allocator<QueryResult>_> results;
  QueryResult local_b0;
  vector<QueryResult_*,_std::allocator<QueryResult_*>_> local_78;
  vector<QueryResult,_std::allocator<QueryResult>_> local_58;
  pointer local_38;
  
  if (this->type == PRIMITIVE) {
    local_b0.results.sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = *(pointer *)&this->ngram;
    local_58.super__Vector_base<QueryResult,_std::allocator<QueryResult>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)counters;
    if ((primitive->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*primitive->_M_invoker)
              (__return_storage_ptr__,(_Any_data *)primitive,(PrimitiveQuery *)&local_b0,
               (QueryCounters **)&local_58);
  }
  else {
    prefetch(this,0,3,false,prefetcher);
    QVar2 = this->type;
    if (QVar2 == MIN_OF) {
      local_58.super__Vector_base<QueryResult,_std::allocator<QueryResult>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<QueryResult,_std::allocator<QueryResult>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<QueryResult,_std::allocator<QueryResult>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78.super__Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78.super__Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<QueryResult,_std::allocator<QueryResult>_>::reserve
                (&local_58,
                 ((long)(this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
      std::vector<QueryResult_*,_std::allocator<QueryResult_*>_>::reserve
                (&local_78,
                 ((long)(this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
      cutoff = this->count;
      pQVar4 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
               super__Vector_impl_data._M_finish;
      this_02 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (this_02 != pQVar4) {
        iVar6 = (int)((ulong)((long)pQVar4 - (long)this_02) >> 3) * 0x38e38e39;
        do {
          run(&local_b0,this_02,primitive,prefetcher,counters);
          if (local_b0.has_everything == true) {
            uVar1 = cutoff - 1;
            bVar5 = 1 < (int)cutoff;
            cutoff = uVar1;
            if (!bVar5) {
              (__return_storage_ptr__->results).run_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (__return_storage_ptr__->results).run_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (__return_storage_ptr__->results).sequence_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (__return_storage_ptr__->results).run_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (__return_storage_ptr__->results).sequence_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (__return_storage_ptr__->results).sequence_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              __return_storage_ptr__->has_everything = true;
            }
          }
          else if ((local_b0.results.sequence_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    local_b0.results.sequence_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish) &&
                  (local_b0.results.run_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start ==
                   local_b0.results.run_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish)) {
            iVar9 = iVar6 + -1;
            bVar5 = (int)cutoff < iVar6;
            iVar6 = iVar9;
            if (!bVar5) {
              QueryResult::empty();
            }
          }
          else {
            std::vector<QueryResult,_std::allocator<QueryResult>_>::emplace_back<QueryResult>
                      (&local_58,&local_b0);
            local_38 = local_58.super__Vector_base<QueryResult,_std::allocator<QueryResult>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -1;
            std::vector<QueryResult*,std::allocator<QueryResult*>>::emplace_back<QueryResult*>
                      ((vector<QueryResult*,std::allocator<QueryResult*>> *)&local_78,&local_38);
            bVar5 = true;
          }
          if (local_b0.results.run_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.results.run_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_b0.results.run_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.results.run_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_b0.results.sequence_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.results.sequence_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_b0.results.sequence_.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.results.sequence_.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar5) goto LAB_00148729;
          this_02 = this_02 + 1;
        } while (this_02 != pQVar4);
      }
      QueryResult::do_min_of(__return_storage_ptr__,cutoff,&local_78,&counters->minofs_);
LAB_00148729:
      if (local_78.super__Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<QueryResult,_std::allocator<QueryResult>_>::~vector(&local_58);
    }
    else if (QVar2 == OR) {
      QueryResult::empty();
      this_01 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                super__Vector_impl_data._M_start;
      pQVar3 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (this_01 != pQVar3) {
        do {
          run(&local_b0,this_01,primitive,prefetcher,counters);
          QueryResult::do_or(__return_storage_ptr__,&local_b0,&counters->ors_);
          if (local_b0.results.run_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.results.run_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_b0.results.run_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.results.run_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_b0.results.sequence_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.results.sequence_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_b0.results.sequence_.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.results.sequence_.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        } while ((__return_storage_ptr__->has_everything == false) &&
                (this_01 = this_01 + 1, this_01 != pQVar3));
      }
    }
    else {
      if (QVar2 != AND) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Unexpected query type");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      (__return_storage_ptr__->results).run_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->results).run_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->results).sequence_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->results).run_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->results).sequence_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->results).sequence_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __return_storage_ptr__->has_everything = true;
      if ((this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar10 = 0;
        uVar8 = 0;
        do {
          uVar8 = uVar8 + 1;
          prefetch(this,(int)uVar8,3,true,prefetcher);
          run(&local_b0,
              (Query *)((long)&((this->queries).super__Vector_base<Query,_std::allocator<Query>_>.
                                _M_impl.super__Vector_impl_data._M_start)->type + lVar10),primitive,
              prefetcher,counters);
          QueryResult::do_and(__return_storage_ptr__,&local_b0,&counters->ands_);
          if (local_b0.results.run_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.results.run_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_b0.results.run_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.results.run_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_b0.results.sequence_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.results.sequence_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_b0.results.sequence_.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.results.sequence_.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        } while ((((__return_storage_ptr__->has_everything != false) ||
                  ((__return_storage_ptr__->results).sequence_.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start !=
                   (__return_storage_ptr__->results).sequence_.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish)) ||
                 ((__return_storage_ptr__->results).run_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  (__return_storage_ptr__->results).run_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish)) &&
                (uVar7 = ((long)(this->queries).super__Vector_base<Query,_std::allocator<Query>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->queries).super__Vector_base<Query,_std::allocator<Query>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7
                , lVar10 = lVar10 + 0x48, uVar8 <= uVar7 && uVar7 - uVar8 != 0));
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QueryResult Query::run(const QueryPrimitive &primitive,
                       const PrefetchFunc &prefetcher,
                       QueryCounters *counters) const {
    // Case: primitive query - reduces to AND with tokens from query plan.
    if (type == QueryType::PRIMITIVE) {
        return primitive(ngram, counters);
    }

    constexpr int PRETECTH_RANGE = 3;
    prefetch(0, PRETECTH_RANGE, false, prefetcher);

    // Case: and. Short circuits when result is already empty.
    if (type == QueryType::AND) {
        auto result = QueryResult::everything();
        for (int i = 0; i < queries.size(); i++) {
            prefetch(i + 1, PRETECTH_RANGE, true, prefetcher);
            const auto &query = queries[i];
            result.do_and(query.run(primitive, prefetcher, counters),
                          &counters->ands());
            if (result.is_empty()) {
                break;
            }
        }
        return result;
    }
    // Case: or. Short circuits when result is already everything.
    if (type == QueryType::OR) {
        auto result = QueryResult::empty();
        for (auto &query : queries) {
            result.do_or(query.run(primitive, prefetcher, counters),
                         &counters->ors());
            if (result.is_everything()) {
                break;
            }
        }
        return result;
    }
    // Case: minof. We remove `everything` and `empty` sets from inputs, and
    // adjust cutoff or input size appropriately. Short circuits in two cases:
    // - cutoff is <= 0 (for example: 0 of ("a", "b")).
    // - cutoff is > size(inputs) (for example: 3 of ("a", "b"))
    // There is some logic duplication here and in QueryResult::do_min_of_real.
    if (type == QueryType::MIN_OF) {
        std::vector<QueryResult> results;
        std::vector<QueryResult *> results_ptrs;
        results.reserve(queries.size());
        results_ptrs.reserve(queries.size());
        int cutoff = count;
        int nonempty_sources = queries.size();
        for (const auto &query : queries) {
            QueryResult next = query.run(primitive, prefetcher, counters);
            if (next.is_everything()) {
                cutoff -= 1;
                if (cutoff <= 0) {
                    return QueryResult::everything();
                }
            } else if (next.is_empty()) {
                nonempty_sources -= 1;
                if (cutoff > nonempty_sources) {
                    return QueryResult::empty();
                }
            } else {
                results.emplace_back(std::move(next));
                results_ptrs.emplace_back(&results.back());
            }
        }
        return QueryResult::do_min_of(cutoff, results_ptrs,
                                      &counters->minofs());
    }
    throw std::runtime_error("Unexpected query type");
}